

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

string * __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true>::debug_type_abi_cxx11_
          (string *__return_storage_ptr__,
          ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true> *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_30 [2];
  long local_20 [2];
  
  if (*(long **)(this + 0x2a550) == (long *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"MSX","");
  }
  else {
    (**(code **)(**(long **)(this + 0x2a550) + 0x28))(local_30);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x4c7ec2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string debug_type() final {
			if(cartridge_primary().handler) {
				return "MSX:" + cartridge_primary().handler->debug_type();
			}
			return "MSX";
		}